

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

void __thiscall libDAI::TFactor<double>::TFactor(TFactor<double> *this,VarSet *ns,Real *p)

{
  size_t n;
  
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)this,&ns->_vars);
  n = ns->_statespace;
  (this->_vs)._statespace = n;
  TProb<double>::TProb(&this->_p,n,p);
  return;
}

Assistant:

TFactor( const VarSet& ns, const Real* p ) : _vs(ns), _p(_vs.stateSpace(),p) {}